

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxReg_3D_C.H
# Opt level: O1

void amrex::fluxreg_fineareaadd
               (Box *bx,Array4<double> *reg,int rcomp,Array4<const_double> *area,
               Array4<const_double> *flx,int fcomp,int ncomp,int dir,Dim3 *ratio,Real mult)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  double *pdVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  double *pdVar27;
  double *pdVar28;
  double *pdVar29;
  int iVar30;
  long lVar31;
  double *pdVar32;
  bool bVar33;
  double dVar34;
  ulong local_f0;
  ulong local_d8;
  long local_d0;
  long local_c8;
  long local_b8;
  int local_84;
  int kc;
  int jc;
  
  iVar1 = (bx->smallend).vect[0];
  lVar31 = (long)iVar1;
  iVar17 = (bx->smallend).vect[1];
  iVar2 = (bx->smallend).vect[2];
  lVar19 = (long)iVar17;
  iVar3 = (bx->bigend).vect[0];
  iVar4 = (bx->bigend).vect[2];
  if (dir == 1) {
    if (0 < ncomp) {
      iVar17 = iVar17 * ratio->y;
      iVar5 = ratio->z;
      local_d0 = (long)fcomp << 3;
      local_f0 = 0;
      do {
        if (iVar2 <= iVar4) {
          iVar18 = iVar2 * iVar5;
          iVar9 = iVar2;
          do {
            if (0 < iVar5) {
              uVar6 = ratio->x;
              lVar10 = lVar31 * 8 * (long)(int)uVar6;
              lVar11 = (long)(int)uVar6 * 8;
              iVar24 = 0;
              iVar23 = iVar18;
              do {
                if (iVar1 <= iVar3) {
                  lVar22 = (lVar19 - (reg->begin).y) * reg->jstride;
                  lVar20 = ((long)iVar9 - (long)(reg->begin).z) * reg->kstride;
                  pdVar8 = reg->p;
                  lVar15 = reg->nstride * ((long)rcomp + local_f0);
                  lVar13 = (long)area->p +
                           (long)(iVar17 - (area->begin).y) * area->jstride * 8 +
                           ((long)iVar23 - (long)(area->begin).z) * area->kstride * 8 +
                           (long)(area->begin).x * -8 + lVar10;
                  iVar30 = (reg->begin).x;
                  lVar14 = (long)flx->p +
                           flx->nstride * local_d0 +
                           (long)(iVar17 - (flx->begin).y) * flx->jstride * 8 +
                           ((long)iVar23 - (long)(flx->begin).z) * flx->kstride * 8 +
                           (long)(flx->begin).x * -8 + lVar10;
                  lVar12 = lVar31;
                  do {
                    if (0 < (int)uVar6) {
                      lVar25 = lVar12 - iVar30;
                      dVar34 = pdVar8[lVar22 + lVar20 + lVar15 + lVar25];
                      uVar16 = 0;
                      do {
                        dVar34 = dVar34 + *(double *)(lVar13 + uVar16 * 8) * mult *
                                          *(double *)(lVar14 + uVar16 * 8);
                        pdVar8[lVar22 + lVar20 + lVar15 + lVar25] = dVar34;
                        uVar16 = uVar16 + 1;
                      } while (uVar6 != uVar16);
                    }
                    lVar12 = lVar12 + 1;
                    lVar13 = lVar13 + lVar11;
                    lVar14 = lVar14 + lVar11;
                  } while (iVar3 + 1 != (int)lVar12);
                }
                iVar24 = iVar24 + 1;
                iVar23 = iVar23 + 1;
              } while (iVar24 != iVar5);
            }
            iVar18 = iVar18 + iVar5;
            bVar33 = iVar9 != iVar4;
            iVar9 = iVar9 + 1;
          } while (bVar33);
        }
        local_f0 = local_f0 + 1;
        local_d0 = local_d0 + 8;
      } while (local_f0 != (uint)ncomp);
    }
  }
  else {
    iVar5 = (bx->bigend).vect[1];
    if (dir == 0) {
      if (0 < ncomp) {
        iVar3 = ratio->z;
        lVar10 = (long)(ratio->x * iVar1) * 8;
        local_c8 = (long)fcomp << 3;
        _kc = 0;
        do {
          if (iVar2 <= iVar4) {
            local_84 = iVar2 * iVar3;
            iVar1 = iVar2;
            do {
              if (0 < iVar3) {
                uVar6 = ratio->y;
                lVar12 = lVar19 * (int)uVar6;
                lVar11 = (long)(int)uVar6 * 8;
                iVar9 = 0;
                iVar18 = local_84;
                do {
                  if (iVar17 <= iVar5) {
                    lVar13 = area->jstride;
                    lVar25 = lVar31 - (reg->begin).x;
                    lVar15 = ((long)iVar1 - (long)(reg->begin).z) * reg->kstride;
                    lVar14 = flx->jstride;
                    pdVar8 = reg->p;
                    lVar26 = reg->nstride * ((long)rcomp + _kc);
                    pdVar28 = (double *)
                              ((long)area->p +
                              (lVar12 - (area->begin).y) * lVar13 * 8 +
                              ((long)iVar18 - (long)(area->begin).z) * area->kstride * 8 +
                              (long)(area->begin).x * -8 + lVar10);
                    iVar23 = (reg->begin).y;
                    lVar22 = reg->jstride;
                    pdVar27 = (double *)
                              ((long)flx->p +
                              flx->nstride * local_c8 +
                              (lVar12 - (flx->begin).y) * lVar14 * 8 +
                              ((long)iVar18 - (long)(flx->begin).z) * flx->kstride * 8 +
                              (long)(flx->begin).x * -8 + lVar10);
                    lVar20 = lVar19;
                    do {
                      if (0 < (int)uVar6) {
                        lVar21 = (lVar20 - iVar23) * lVar22;
                        dVar34 = pdVar8[lVar25 + lVar15 + lVar26 + lVar21];
                        uVar16 = (ulong)uVar6;
                        pdVar29 = pdVar27;
                        pdVar32 = pdVar28;
                        do {
                          dVar34 = dVar34 + *pdVar32 * mult * *pdVar29;
                          pdVar8[lVar25 + lVar15 + lVar26 + lVar21] = dVar34;
                          pdVar32 = pdVar32 + lVar13;
                          pdVar29 = pdVar29 + lVar14;
                          uVar16 = uVar16 - 1;
                        } while (uVar16 != 0);
                      }
                      lVar20 = lVar20 + 1;
                      pdVar28 = (double *)((long)pdVar28 + lVar13 * lVar11);
                      pdVar27 = (double *)((long)pdVar27 + lVar14 * lVar11);
                    } while (iVar5 + 1 != (int)lVar20);
                  }
                  iVar9 = iVar9 + 1;
                  iVar18 = iVar18 + 1;
                } while (iVar9 != iVar3);
              }
              local_84 = local_84 + iVar3;
              bVar33 = iVar1 != iVar4;
              iVar1 = iVar1 + 1;
            } while (bVar33);
          }
          _kc = _kc + 1;
          local_c8 = local_c8 + 8;
        } while (_kc != (uint)ncomp);
      }
    }
    else if (0 < ncomp) {
      iVar18 = iVar2 * ratio->z;
      iVar4 = ratio->y;
      local_b8 = (long)fcomp << 3;
      local_d8 = 0;
      do {
        if (iVar17 <= iVar5) {
          iVar9 = iVar17 * iVar4;
          iVar23 = iVar17;
          do {
            if (0 < iVar4) {
              uVar6 = ratio->x;
              lVar19 = lVar31 * 8 * (long)(int)uVar6;
              lVar10 = (long)(int)uVar6 * 8;
              iVar30 = 0;
              iVar24 = iVar9;
              do {
                if (iVar1 <= iVar3) {
                  lVar14 = ((long)iVar23 - (long)(reg->begin).y) * reg->jstride;
                  lVar22 = ((long)iVar2 - (long)(reg->begin).z) * reg->kstride;
                  pdVar8 = reg->p;
                  lVar20 = reg->nstride * ((long)rcomp + local_d8);
                  lVar12 = (long)area->p +
                           (long)(iVar18 - (area->begin).z) * area->kstride * 8 +
                           ((long)iVar24 - (long)(area->begin).y) * area->jstride * 8 +
                           (long)(area->begin).x * -8 + lVar19;
                  iVar7 = (reg->begin).x;
                  lVar13 = (long)flx->p +
                           flx->nstride * local_b8 +
                           (long)(iVar18 - (flx->begin).z) * flx->kstride * 8 +
                           ((long)iVar24 - (long)(flx->begin).y) * flx->jstride * 8 +
                           (long)(flx->begin).x * -8 + lVar19;
                  lVar11 = lVar31;
                  do {
                    if (0 < (int)uVar6) {
                      lVar15 = lVar11 - iVar7;
                      dVar34 = pdVar8[lVar14 + lVar22 + lVar20 + lVar15];
                      uVar16 = 0;
                      do {
                        dVar34 = dVar34 + *(double *)(lVar12 + uVar16 * 8) * mult *
                                          *(double *)(lVar13 + uVar16 * 8);
                        pdVar8[lVar14 + lVar22 + lVar20 + lVar15] = dVar34;
                        uVar16 = uVar16 + 1;
                      } while (uVar6 != uVar16);
                    }
                    lVar11 = lVar11 + 1;
                    lVar12 = lVar12 + lVar10;
                    lVar13 = lVar13 + lVar10;
                  } while (iVar3 + 1 != (int)lVar11);
                }
                iVar30 = iVar30 + 1;
                iVar24 = iVar24 + 1;
              } while (iVar30 != iVar4);
            }
            iVar9 = iVar9 + iVar4;
            bVar33 = iVar23 != iVar5;
            iVar23 = iVar23 + 1;
          } while (bVar33);
        }
        local_d8 = local_d8 + 1;
        local_b8 = local_b8 + 8;
      } while (local_d8 != (uint)ncomp);
    }
  }
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE inline void
fluxreg_fineareaadd (Box const& bx, Array4<Real> const& reg, const int rcomp,
                     Array4<Real const> const& area,
                     Array4<Real const> const& flx, const int fcomp, const int ncomp,
                     const int dir, Dim3 const& ratio, const Real mult) noexcept
{
    const auto lo  = amrex::lbound(bx);
    const auto hi  = amrex::ubound(bx);

    switch (dir) {
    case 0:
    {
        const int ic = lo.x;
        const int i = ic*ratio.x;
        for (int n = 0; n < ncomp; ++n) {
            for (int kc = lo.z; kc <= hi.z; ++kc) {
                for (int koff = 0; koff < ratio.z; ++koff) {
                    const int k = ratio.z*kc + koff;
                    for (int jc = lo.y; jc <= hi.y; ++jc) {
                        for (int joff = 0; joff < ratio.y; ++joff) {
                            const int j = ratio.y*jc + joff;
                            reg(ic,jc,kc,n+rcomp) += mult*area(i,j,k)
                                                         * flx(i,j,k,n+fcomp);
                        }
                    }
                }
            }
        }
        break;
    }
    case 1:
    {
        const int jc = lo.y;
        const int j = jc*ratio.y;
        for (int n = 0; n < ncomp; ++n) {
            for (int kc = lo.z; kc <= hi.z; ++kc) {
                for (int koff = 0; koff < ratio.z; ++koff) {
                    const int k = ratio.z*kc + koff;
                    for (int ic = lo.x; ic <= hi.x; ++ic) {
                        for (int ioff = 0; ioff < ratio.x; ++ioff) {
                            const int i = ratio.x*ic + ioff;
                            reg(ic,jc,kc,n+rcomp) += mult*area(i,j,k)
                                                         * flx(i,j,k,n+fcomp);
                        }
                    }
                }
            }
        }
        break;
    }
    default:
    {
        const int kc = lo.z;
        const int k = kc*ratio.z;
        for (int n = 0; n < ncomp; ++n) {
            for (int jc = lo.y; jc <= hi.y; ++jc) {
                for (int joff = 0; joff < ratio.y; ++joff) {
                    const int j = ratio.y*jc + joff;
                    for (int ic = lo.x; ic <= hi.x; ++ic) {
                        for (int ioff = 0; ioff < ratio.x; ++ioff) {
                            const int i = ratio.x*ic + ioff;
                            reg(ic,jc,kc,n+rcomp) += mult*area(i,j,k)
                                                         * flx(i,j,k,n+fcomp);
                        }
                    }
                }
            }
        }
    }
    }
}